

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::cpp::IsLazilyInitializedFile(cpp *this,string_view filename)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  
  __x._M_str = (char *)filename._M_len;
  __x._M_len = (size_t)this;
  __y._M_str = "third_party/protobuf/cpp_features.proto";
  __y._M_len = 0x27;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    __x_00._M_str = __x._M_str;
    __x_00._M_len = (size_t)this;
    __y_00._M_str = "google/protobuf/cpp_features.proto";
    __y_00._M_len = 0x22;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      __x_01._M_str = __x._M_str;
      __x_01._M_len = (size_t)this;
      __y_01._M_str = "net/proto2/proto/descriptor.proto";
      __y_01._M_len = 0x21;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        __x_02._M_str = __x._M_str;
        __x_02._M_len = (size_t)this;
        __y_02._M_str = "google/protobuf/descriptor.proto";
        __y_02._M_len = 0x20;
        bVar1 = std::operator==(__x_02,__y_02);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool IsLazilyInitializedFile(absl::string_view filename) {
  if (filename == "third_party/protobuf/cpp_features.proto" ||
      filename == "google/protobuf/cpp_features.proto") {
    return true;
  }
  return filename == "net/proto2/proto/descriptor.proto" ||
         filename == "google/protobuf/descriptor.proto";
}